

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O3

void x_array_setup(void)

{
  undefined8 in_RAX;
  t_symbol *ptVar1;
  _class *p_Var2;
  uint uVar4;
  ulong uVar3;
  
  uVar4 = (uint)((ulong)in_RAX >> 0x20);
  ptVar1 = gensym("array define");
  array_define_class = class_new(ptVar1,(t_newmethod)0x0,canvas_free,0xf8,0,A_NULL);
  canvas_add_for_class(array_define_class);
  p_Var2 = array_define_class;
  ptVar1 = gensym("send");
  class_addmethod(p_Var2,array_define_send,ptVar1,A_SYMBOL,0);
  class_addbang(array_define_class,array_define_bang);
  class_addanything(array_define_class,array_define_anything);
  p_Var2 = array_define_class;
  ptVar1 = gensym("array-object");
  class_sethelpsymbol(p_Var2,ptVar1);
  class_setsavefn(array_define_class,array_define_save);
  p_Var2 = array_define_class;
  ptVar1 = gensym("done-popup");
  uVar3 = (ulong)uVar4 << 0x20;
  class_addmethod(p_Var2,array_define_done_popup,ptVar1,A_FLOAT,1,1,uVar3);
  p_Var2 = array_define_class;
  ptVar1 = gensym("editmode");
  class_addmethod(p_Var2,array_define_ignore,ptVar1,A_GIMME);
  ptVar1 = gensym("array");
  class_addcreator(arrayobj_new,ptVar1,A_GIMME,0);
  ptVar1 = gensym("table");
  class_addcreator(table_new,ptVar1,A_DEFSYM,6);
  ptVar1 = gensym("array size");
  uVar3 = uVar3 & 0xffffffff00000000;
  array_size_class = class_new(ptVar1,array_size_new,array_client_free,0x68,0,A_GIMME,uVar3);
  class_addbang(array_size_class,array_size_bang);
  class_doaddfloat(array_size_class,array_size_float);
  p_Var2 = array_size_class;
  ptVar1 = gensym("array-object");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("array sum");
  uVar3 = uVar3 & 0xffffffff00000000;
  array_sum_class = class_new(ptVar1,array_sum_new,array_client_free,0x80,0,A_GIMME,uVar3);
  class_addbang(array_sum_class,array_sum_bang);
  class_doaddfloat(array_sum_class,array_sum_float);
  p_Var2 = array_sum_class;
  ptVar1 = gensym("array-object");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("array get");
  uVar3 = uVar3 & 0xffffffff00000000;
  array_get_class = class_new(ptVar1,array_get_new,array_client_free,0x80,0,A_GIMME,uVar3);
  class_addbang(array_get_class,array_get_bang);
  class_doaddfloat(array_get_class,array_get_float);
  p_Var2 = array_get_class;
  ptVar1 = gensym("array-object");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("array set");
  uVar3 = uVar3 & 0xffffffff00000000;
  array_set_class = class_new(ptVar1,array_set_new,array_client_free,0x80,0,A_GIMME,uVar3);
  class_addlist(array_set_class,array_set_list);
  p_Var2 = array_set_class;
  ptVar1 = gensym("array-object");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("array quantile");
  uVar3 = uVar3 & 0xffffffff00000000;
  array_quantile_class = class_new(ptVar1,array_quantile_new,array_client_free,0x80,0,A_GIMME,uVar3)
  ;
  class_doaddfloat(array_quantile_class,array_quantile_float);
  p_Var2 = array_quantile_class;
  ptVar1 = gensym("array-object");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("array random");
  uVar3 = uVar3 & 0xffffffff00000000;
  p_Var2 = class_new(ptVar1,array_random_new,array_client_free,0x88,0,A_GIMME,uVar3);
  array_random_class = p_Var2;
  ptVar1 = gensym("seed");
  class_addmethod(p_Var2,array_random_seed,ptVar1,A_FLOAT);
  class_doaddfloat(array_random_class,array_random_float);
  class_addbang(array_random_class,array_random_bang);
  p_Var2 = array_random_class;
  ptVar1 = gensym("array-object");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("array max");
  uVar3 = uVar3 & 0xffffffff00000000;
  array_max_class = class_new(ptVar1,array_max_new,array_client_free,0x90,0,A_GIMME,uVar3);
  class_doaddfloat(array_max_class,array_max_float);
  class_addbang(array_max_class,array_max_bang);
  p_Var2 = array_max_class;
  ptVar1 = gensym("array-object");
  class_sethelpsymbol(p_Var2,ptVar1);
  ptVar1 = gensym("array min");
  array_min_class =
       class_new(ptVar1,array_min_new,array_client_free,0x90,0,A_GIMME,uVar3 & 0xffffffff00000000);
  class_doaddfloat(array_min_class,array_min_float);
  class_addbang(array_min_class,array_min_bang);
  p_Var2 = array_min_class;
  ptVar1 = gensym("array-object");
  class_sethelpsymbol(p_Var2,ptVar1);
  return;
}

Assistant:

void x_array_setup(void)
{
    array_define_class = class_new(gensym("array define"), 0,
        (t_method)canvas_free, sizeof(t_canvas), 0, 0);
    canvas_add_for_class(array_define_class);
    class_addmethod(array_define_class, (t_method)array_define_send,
        gensym("send"), A_SYMBOL, 0);
    class_addbang(array_define_class, array_define_bang);
    class_addanything(array_define_class, array_define_anything);
    class_sethelpsymbol(array_define_class, gensym("array-object"));
    class_setsavefn(array_define_class, array_define_save);

    class_addmethod(array_define_class, (t_method)array_define_done_popup,
        gensym("done-popup"), A_FLOAT, A_FLOAT, A_FLOAT, A_NULL);

    class_addmethod(array_define_class, (t_method)array_define_ignore,
        gensym("editmode"), A_GIMME, 0);

    class_addcreator((t_newmethod)arrayobj_new, gensym("array"), A_GIMME, 0);

    class_addcreator((t_newmethod)table_new, gensym("table"),
        A_DEFSYM, A_DEFFLOAT, 0);

    array_size_class = class_new(gensym("array size"),
        (t_newmethod)array_size_new, (t_method)array_client_free,
            sizeof(t_array_size), 0, A_GIMME, 0);
    class_addbang(array_size_class, array_size_bang);
    class_addfloat(array_size_class, array_size_float);
    class_sethelpsymbol(array_size_class, gensym("array-object"));

    array_sum_class = class_new(gensym("array sum"),
        (t_newmethod)array_sum_new, (t_method)array_client_free,
            sizeof(t_array_sum), 0, A_GIMME, 0);
    class_addbang(array_sum_class, array_sum_bang);
    class_addfloat(array_sum_class, array_sum_float);
    class_sethelpsymbol(array_sum_class, gensym("array-object"));

    array_get_class = class_new(gensym("array get"),
        (t_newmethod)array_get_new, (t_method)array_client_free,
            sizeof(t_array_get), 0, A_GIMME, 0);
    class_addbang(array_get_class, array_get_bang);
    class_addfloat(array_get_class, array_get_float);
    class_sethelpsymbol(array_get_class, gensym("array-object"));

    array_set_class = class_new(gensym("array set"),
        (t_newmethod)array_set_new, (t_method)array_client_free,
            sizeof(t_array_set), 0, A_GIMME, 0);
    class_addlist(array_set_class, array_set_list);
    class_sethelpsymbol(array_set_class, gensym("array-object"));

    array_quantile_class = class_new(gensym("array quantile"),
        (t_newmethod)array_quantile_new, (t_method)array_client_free,
            sizeof(t_array_quantile), 0, A_GIMME, 0);
    class_addfloat(array_quantile_class, array_quantile_float);
    class_sethelpsymbol(array_quantile_class, gensym("array-object"));

    array_random_class = class_new(gensym("array random"),
        (t_newmethod)array_random_new, (t_method)array_client_free,
            sizeof(t_array_random), 0, A_GIMME, 0);
    class_addmethod(array_random_class, (t_method)array_random_seed,
        gensym("seed"), A_FLOAT, 0);
    class_addfloat(array_random_class, array_random_float);
    class_addbang(array_random_class, array_random_bang);
    class_sethelpsymbol(array_random_class, gensym("array-object"));

    array_max_class = class_new(gensym("array max"),
        (t_newmethod)array_max_new, (t_method)array_client_free,
            sizeof(t_array_max), 0, A_GIMME, 0);
    class_addfloat(array_max_class, array_max_float);
    class_addbang(array_max_class, array_max_bang);
    class_sethelpsymbol(array_max_class, gensym("array-object"));

    array_min_class = class_new(gensym("array min"),
        (t_newmethod)array_min_new, (t_method)array_client_free,
            sizeof(t_array_min), 0, A_GIMME, 0);
    class_addfloat(array_min_class, array_min_float);
    class_addbang(array_min_class, array_min_bang);
    class_sethelpsymbol(array_min_class, gensym("array-object"));
}